

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveLright2(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *vec,int *ridx,int *rn,
               number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *eps,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *vec2,int *ridx2,int *rn2,
               number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *eps2)

{
  uint *puVar1;
  fpclass_type fVar2;
  uint uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  fpclass_type fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  int iVar10;
  int iVar11;
  cpp_dec_float<50U,_int,_void> *pcVar12;
  cpp_dec_float<50U,_int,_void> *pcVar13;
  int *piVar14;
  cpp_dec_float<50U,_int,_void> *pcVar15;
  int32_t iVar16;
  undefined1 uVar17;
  ulong uVar18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  cpp_dec_float<50U,_int,_void> local_488;
  ulong local_448;
  ulong local_440;
  cpp_dec_float<50U,_int,_void> local_438;
  int *local_3f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3f0;
  cpp_dec_float<50U,_int,_void> local_3e8;
  ulong local_3a8;
  ulong local_3a0;
  int *local_398;
  pointer local_390;
  int *local_388;
  int *local_380;
  int *local_378;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_370;
  cpp_dec_float<50U,_int,_void> local_368;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_330;
  cpp_dec_float<50U,_int,_void> local_328;
  cpp_dec_float<50U,_int,_void> local_2e8;
  cpp_dec_float<50U,_int,_void> local_2a8;
  cpp_dec_float<50U,_int,_void> local_268;
  cpp_dec_float<50U,_int,_void> local_228;
  cpp_dec_float<50U,_int,_void> local_1e8;
  cpp_dec_float<50U,_int,_void> local_1a8;
  cpp_dec_float<50U,_int,_void> local_168;
  cpp_dec_float<50U,_int,_void> local_128;
  cpp_dec_float<50U,_int,_void> local_e8;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_3e8.fpclass = cpp_dec_float_finite;
  local_3e8.prec_elem = 10;
  local_3e8.data._M_elems[0] = 0;
  local_3e8.data._M_elems[1] = 0;
  local_3e8.data._M_elems[2] = 0;
  local_3e8.data._M_elems[3] = 0;
  local_3e8.data._M_elems[4] = 0;
  local_3e8.data._M_elems[5] = 0;
  local_3e8.data._M_elems._24_5_ = 0;
  local_3e8.data._M_elems[7]._1_3_ = 0;
  local_3e8.data._M_elems[8] = 0;
  local_3e8.data._M_elems[9] = 0;
  local_3e8.exp = 0;
  local_3e8.neg = false;
  local_438.fpclass = cpp_dec_float_finite;
  local_438.prec_elem = 10;
  local_438.data._M_elems[0] = 0;
  local_438.data._M_elems[1] = 0;
  local_438.data._M_elems[2] = 0;
  local_438.data._M_elems[3] = 0;
  local_438.data._M_elems[4] = 0;
  local_438.data._M_elems[5] = 0;
  local_438.data._M_elems._24_5_ = 0;
  local_438.data._M_elems[7]._1_3_ = 0;
  local_438.data._M_elems[8] = 0;
  local_438.data._M_elems[9] = 0;
  local_438.exp = 0;
  local_438.neg = false;
  local_390 = (this->l).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_398 = (this->l).idx;
  local_378 = (this->l).row;
  local_3f8 = (this->l).start;
  local_3a8 = (ulong)(this->l).firstUpdate;
  local_3f0 = vec;
  local_388 = ridx;
  local_380 = rn;
  local_370 = eps;
  if ((long)local_3a8 < 1) {
    local_3a8 = 0;
  }
  else {
    uVar18 = 0;
    local_330 = this;
    do {
      iVar9 = local_378[uVar18];
      local_438.data._M_elems._32_8_ = *(undefined8 *)(vec2[iVar9].m_backend.data._M_elems + 8);
      local_438.data._M_elems._0_8_ = *(undefined8 *)vec2[iVar9].m_backend.data._M_elems;
      local_438.data._M_elems._8_8_ = *(undefined8 *)(vec2[iVar9].m_backend.data._M_elems + 2);
      puVar1 = vec2[iVar9].m_backend.data._M_elems + 4;
      local_438.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar4 = *(undefined8 *)(puVar1 + 2);
      local_438.data._M_elems._24_5_ = SUB85(uVar4,0);
      local_438.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      local_438.exp = vec2[iVar9].m_backend.exp;
      local_438.neg = vec2[iVar9].m_backend.neg;
      local_438.fpclass = vec2[iVar9].m_backend.fpclass;
      local_438.prec_elem = vec2[iVar9].m_backend.prec_elem;
      local_3e8.data._M_elems._0_8_ = *(undefined8 *)local_3f0[iVar9].m_backend.data._M_elems;
      local_3e8.data._M_elems._8_8_ = *(undefined8 *)(local_3f0[iVar9].m_backend.data._M_elems + 2);
      puVar1 = local_3f0[iVar9].m_backend.data._M_elems + 4;
      local_3e8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar4 = *(undefined8 *)(puVar1 + 2);
      local_3e8.data._M_elems._24_5_ = SUB85(uVar4,0);
      local_3e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      local_3e8.data._M_elems._32_8_ = *(undefined8 *)(local_3f0[iVar9].m_backend.data._M_elems + 8)
      ;
      local_488.exp = local_3f0[iVar9].m_backend.exp;
      local_3e8.neg = local_3f0[iVar9].m_backend.neg;
      local_3e8.fpclass = local_3f0[iVar9].m_backend.fpclass;
      local_3e8.prec_elem = local_3f0[iVar9].m_backend.prec_elem;
      local_488.data._M_elems._32_8_ = *(undefined8 *)(local_3f0[iVar9].m_backend.data._M_elems + 8)
      ;
      local_488.data._M_elems._0_8_ = *(undefined8 *)local_3f0[iVar9].m_backend.data._M_elems;
      local_488.data._M_elems._8_8_ = *(undefined8 *)(local_3f0[iVar9].m_backend.data._M_elems + 2);
      puVar1 = local_3f0[iVar9].m_backend.data._M_elems + 4;
      local_488.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar4 = *(undefined8 *)(puVar1 + 2);
      local_488.data._M_elems._24_5_ = SUB85(uVar4,0);
      local_488.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      local_68.data._M_elems._0_8_ = *(undefined8 *)(local_370->m_backend).data._M_elems;
      local_68.data._M_elems._8_8_ = *(undefined8 *)((local_370->m_backend).data._M_elems + 2);
      local_68.data._M_elems._16_8_ = *(undefined8 *)((local_370->m_backend).data._M_elems + 4);
      local_68.data._M_elems._24_8_ = *(undefined8 *)((local_370->m_backend).data._M_elems + 6);
      local_68.data._M_elems._32_8_ = *(undefined8 *)((local_370->m_backend).data._M_elems + 8);
      local_68.exp = (local_370->m_backend).exp;
      local_68.neg = (local_370->m_backend).neg;
      local_68.fpclass = (local_370->m_backend).fpclass;
      local_68.prec_elem = (local_370->m_backend).prec_elem;
      local_488.prec_elem = local_3e8.prec_elem;
      local_488.fpclass = local_3e8.fpclass;
      local_488.neg = local_3e8.neg;
      if ((local_3e8.neg == true) &&
         (local_488.data._M_elems[0] != 0 || local_3e8.fpclass != cpp_dec_float_finite)) {
        local_488.neg = false;
      }
      local_440 = uVar18;
      local_3e8.exp = local_488.exp;
      if (local_68.fpclass == cpp_dec_float_NaN || local_3e8.fpclass == cpp_dec_float_NaN) {
        iVar9 = (eps2->m_backend).exp;
        uVar17 = (eps2->m_backend).neg;
        iVar16 = (eps2->m_backend).prec_elem;
        local_488.fpclass = local_438.fpclass;
        local_488.prec_elem = local_438.prec_elem;
        fVar2 = (eps2->m_backend).fpclass;
LAB_002ad6bd:
        local_1e8.fpclass = fVar2;
        local_488.data._M_elems[8] = local_438.data._M_elems[8];
        local_488.data._M_elems[9] = local_438.data._M_elems[9];
        local_488.data._M_elems[4] = local_438.data._M_elems[4];
        local_488.data._M_elems[5] = local_438.data._M_elems[5];
        local_488.data._M_elems._24_5_ = local_438.data._M_elems._24_5_;
        local_488.data._M_elems[7]._1_3_ = local_438.data._M_elems[7]._1_3_;
        local_488.data._M_elems[2] = local_438.data._M_elems[2];
        local_488.data._M_elems[3] = local_438.data._M_elems[3];
        local_488.data._M_elems[0] = local_438.data._M_elems[0];
        local_488.data._M_elems[1] = local_438.data._M_elems[1];
        auVar5 = (undefined1  [16])local_488.data._M_elems._0_16_;
        local_1e8.data._M_elems._0_8_ = *(undefined8 *)(eps2->m_backend).data._M_elems;
        local_1e8.data._M_elems._8_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 2);
        local_1e8.data._M_elems._16_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 4);
        local_1e8.data._M_elems._24_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 6);
        local_1e8.data._M_elems._32_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 8);
        local_488.neg = local_438.neg;
        if (((local_438.neg & 1U) != 0) &&
           (local_488.data._M_elems[0] = local_438.data._M_elems[0],
           local_488.data._M_elems[0] != 0 || local_488.fpclass != cpp_dec_float_finite)) {
          local_488.neg = (bool)(local_438.neg ^ 1);
        }
        local_1e8.exp = iVar9;
        local_1e8.neg = (bool)uVar17;
        local_1e8.prec_elem = iVar16;
        if ((local_1e8.fpclass != cpp_dec_float_NaN && local_488.fpclass != cpp_dec_float_NaN) &&
           (local_488.data._M_elems._0_16_ = auVar5, local_488.exp = local_438.exp,
           iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_488,&local_1e8), 0 < iVar9)) {
          local_448 = (ulong)local_3f8[local_440];
          iVar9 = local_3f8[local_440 + 1];
          if (local_3f8[local_440] < iVar9) {
            pcVar15 = &local_390[local_448].m_backend;
            piVar14 = local_398 + local_448;
            do {
              iVar11 = *piVar14;
              local_328.fpclass = cpp_dec_float_finite;
              local_328.prec_elem = 10;
              local_328.data._M_elems[0] = 0;
              local_328.data._M_elems[1] = 0;
              local_328.data._M_elems[2] = 0;
              local_328.data._M_elems[3] = 0;
              local_328.data._M_elems[4] = 0;
              local_328.data._M_elems[5] = 0;
              local_328.data._M_elems._24_5_ = 0;
              local_328.data._M_elems[7]._1_3_ = 0;
              local_328.data._M_elems[8] = 0;
              local_328.data._M_elems[9] = 0;
              local_328.exp = 0;
              local_328.neg = false;
              pcVar13 = &local_438;
              if (pcVar15 != &local_328) {
                local_328.data._M_elems[8] = local_438.data._M_elems[8];
                local_328.data._M_elems[9] = local_438.data._M_elems[9];
                local_328.data._M_elems[4] = local_438.data._M_elems[4];
                local_328.data._M_elems[5] = local_438.data._M_elems[5];
                local_328.data._M_elems._24_5_ = local_438.data._M_elems._24_5_;
                local_328.data._M_elems[7]._1_3_ = local_438.data._M_elems[7]._1_3_;
                local_328.data._M_elems[2] = local_438.data._M_elems[2];
                local_328.data._M_elems[3] = local_438.data._M_elems[3];
                local_328.data._M_elems[0] = local_438.data._M_elems[0];
                local_328.data._M_elems[1] = local_438.data._M_elems[1];
                local_328.exp = local_438.exp;
                local_328.neg = local_438.neg;
                local_328.fpclass = local_438.fpclass;
                local_328.prec_elem = local_438.prec_elem;
                pcVar13 = pcVar15;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_328,pcVar13);
              pcVar13 = &vec2[iVar11].m_backend;
              if (vec2[iVar11].m_backend.fpclass != cpp_dec_float_NaN) {
                local_488.fpclass = cpp_dec_float_finite;
                local_488.prec_elem = 10;
                local_488.data._M_elems[0] = 0;
                local_488.data._M_elems[1] = 0;
                local_488.data._M_elems[2] = 0;
                local_488.data._M_elems[3] = 0;
                local_488.data._M_elems[4] = 0;
                local_488.data._M_elems[5] = 0;
                local_488.data._M_elems._24_5_ = 0;
                local_488.data._M_elems[7]._1_3_ = 0;
                local_488.data._M_elems[8] = 0;
                local_488.data._M_elems[9] = 0;
                local_488.exp = 0;
                local_488.neg = false;
                pcVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
                local_488.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar12->data)._M_elems;
                local_488.data._M_elems._16_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 4);
                uVar4 = *(undefined8 *)((pcVar12->data)._M_elems + 6);
                local_488.data._M_elems._24_5_ = SUB85(uVar4,0);
                local_488.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                local_488.data._M_elems._32_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 8);
                local_488.exp = pcVar12->exp;
                local_488.neg = pcVar12->neg;
                local_488.fpclass = pcVar12->fpclass;
                local_488.prec_elem = pcVar12->prec_elem;
                iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (pcVar13,&local_488);
                if (iVar10 == 0) {
                  ridx2[*rn2] = iVar11;
                  *rn2 = *rn2 + 1;
                }
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (pcVar13,&local_328);
              if (pcVar13->fpclass != cpp_dec_float_NaN) {
                local_488.fpclass = cpp_dec_float_finite;
                local_488.prec_elem = 10;
                local_488.data._M_elems[0] = 0;
                local_488.data._M_elems[1] = 0;
                local_488.data._M_elems[2] = 0;
                local_488.data._M_elems[3] = 0;
                local_488.data._M_elems[4] = 0;
                local_488.data._M_elems[5] = 0;
                local_488.data._M_elems._24_5_ = 0;
                local_488.data._M_elems[7]._1_3_ = 0;
                local_488.data._M_elems[8] = 0;
                local_488.data._M_elems[9] = 0;
                local_488.exp = 0;
                local_488.neg = false;
                pcVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
                local_488.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar12->data)._M_elems;
                local_488.data._M_elems._16_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 4);
                uVar4 = *(undefined8 *)((pcVar12->data)._M_elems + 6);
                local_488.data._M_elems._24_5_ = SUB85(uVar4,0);
                local_488.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                local_488.data._M_elems._32_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 8);
                local_488.exp = pcVar12->exp;
                local_488.neg = pcVar12->neg;
                local_488.fpclass = pcVar12->fpclass;
                local_488.prec_elem = pcVar12->prec_elem;
                iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (pcVar13,&local_488);
                if (iVar11 == 0) {
                  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                            ((cpp_dec_float<50u,int,void> *)pcVar13,1e-100);
                }
              }
              piVar14 = piVar14 + 1;
              pcVar15 = pcVar15 + 1;
              iVar9 = iVar9 + -1;
            } while ((int)local_448 < iVar9);
          }
        }
      }
      else {
        iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_488,&local_68);
        fVar6 = local_438.fpclass;
        iVar9 = (eps2->m_backend).exp;
        uVar17 = (eps2->m_backend).neg;
        fVar2 = (eps2->m_backend).fpclass;
        iVar16 = (eps2->m_backend).prec_elem;
        local_488.fpclass = local_438.fpclass;
        local_488.prec_elem = local_438.prec_elem;
        if (iVar11 < 1) goto LAB_002ad6bd;
        local_448 = (ulong)local_3f8[uVar18];
        local_488.data._M_elems[8] = local_438.data._M_elems[8];
        local_488.data._M_elems[9] = local_438.data._M_elems[9];
        local_488.data._M_elems[4] = local_438.data._M_elems[4];
        local_488.data._M_elems[5] = local_438.data._M_elems[5];
        local_488.data._M_elems._24_5_ = local_438.data._M_elems._24_5_;
        local_488.data._M_elems[7]._1_3_ = local_438.data._M_elems[7]._1_3_;
        local_488.data._M_elems[2] = local_438.data._M_elems[2];
        local_488.data._M_elems[3] = local_438.data._M_elems[3];
        local_488.data._M_elems[0] = local_438.data._M_elems[0];
        local_488.data._M_elems[1] = local_438.data._M_elems[1];
        auVar5 = (undefined1  [16])local_488.data._M_elems._0_16_;
        local_1a8.data._M_elems._0_8_ = *(undefined8 *)(eps2->m_backend).data._M_elems;
        local_1a8.data._M_elems._8_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 2);
        local_1a8.data._M_elems._16_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 4);
        local_1a8.data._M_elems._24_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 6);
        local_1a8.data._M_elems._32_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 8);
        local_488.exp = local_438.exp;
        local_488.neg = local_438.neg;
        local_488.fpclass = local_438.fpclass;
        local_488.prec_elem = local_438.prec_elem;
        if (((local_438.neg & 1U) != 0) &&
           (local_488.data._M_elems[0] = local_438.data._M_elems[0],
           local_488.data._M_elems[0] != 0 || fVar6 != cpp_dec_float_finite)) {
          local_488.neg = (bool)(local_438.neg ^ 1);
        }
        piVar14 = local_398 + local_448;
        pcVar15 = &local_390[local_448].m_backend;
        local_488.data._M_elems._0_16_ = auVar5;
        local_1a8.exp = iVar9;
        local_1a8.neg = (bool)uVar17;
        local_1a8.fpclass = fVar2;
        local_1a8.prec_elem = iVar16;
        if ((fVar2 == cpp_dec_float_NaN || fVar6 == cpp_dec_float_NaN) ||
           (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_488,&local_1a8), iVar9 < 1)) {
          for (iVar9 = local_3f8[local_440 + 1]; (int)local_448 < iVar9; iVar9 = iVar9 + -1) {
            iVar11 = *piVar14;
            local_2e8.fpclass = cpp_dec_float_finite;
            local_2e8.prec_elem = 10;
            local_2e8.data._M_elems[0] = 0;
            local_2e8.data._M_elems[1] = 0;
            local_2e8.data._M_elems[2] = 0;
            local_2e8.data._M_elems[3] = 0;
            local_2e8.data._M_elems[4] = 0;
            local_2e8.data._M_elems[5] = 0;
            local_2e8.data._M_elems._24_5_ = 0;
            local_2e8.data._M_elems[7]._1_3_ = 0;
            local_2e8.data._M_elems[8] = 0;
            local_2e8.data._M_elems[9] = 0;
            local_2e8.exp = 0;
            local_2e8.neg = false;
            pcVar13 = &local_3e8;
            if (pcVar15 != &local_2e8) {
              local_2e8.data._M_elems[8] = local_3e8.data._M_elems[8];
              local_2e8.data._M_elems[9] = local_3e8.data._M_elems[9];
              local_2e8.data._M_elems[4] = local_3e8.data._M_elems[4];
              local_2e8.data._M_elems[5] = local_3e8.data._M_elems[5];
              local_2e8.data._M_elems._24_5_ = local_3e8.data._M_elems._24_5_;
              local_2e8.data._M_elems[7]._1_3_ = local_3e8.data._M_elems[7]._1_3_;
              local_2e8.data._M_elems[2] = local_3e8.data._M_elems[2];
              local_2e8.data._M_elems[3] = local_3e8.data._M_elems[3];
              local_2e8.data._M_elems[0] = local_3e8.data._M_elems[0];
              local_2e8.data._M_elems[1] = local_3e8.data._M_elems[1];
              local_2e8.exp = local_3e8.exp;
              local_2e8.neg = local_3e8.neg;
              local_2e8.fpclass = local_3e8.fpclass;
              local_2e8.prec_elem = local_3e8.prec_elem;
              pcVar13 = pcVar15;
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      (&local_2e8,pcVar13);
            pcVar13 = &local_3f0[iVar11].m_backend;
            if (local_3f0[iVar11].m_backend.fpclass != cpp_dec_float_NaN) {
              local_488.fpclass = cpp_dec_float_finite;
              local_488.prec_elem = 10;
              local_488.data._M_elems[0] = 0;
              local_488.data._M_elems[1] = 0;
              local_488.data._M_elems[2] = 0;
              local_488.data._M_elems[3] = 0;
              local_488.data._M_elems[4] = 0;
              local_488.data._M_elems[5] = 0;
              local_488.data._M_elems._24_5_ = 0;
              local_488.data._M_elems[7]._1_3_ = 0;
              local_488.data._M_elems[8] = 0;
              local_488.data._M_elems[9] = 0;
              local_488.exp = 0;
              local_488.neg = false;
              pcVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
              local_488.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar12->data)._M_elems;
              local_488.data._M_elems._16_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 4);
              uVar4 = *(undefined8 *)((pcVar12->data)._M_elems + 6);
              local_488.data._M_elems._24_5_ = SUB85(uVar4,0);
              local_488.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
              local_488.data._M_elems._32_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 8);
              local_488.exp = pcVar12->exp;
              local_488.neg = pcVar12->neg;
              local_488.fpclass = pcVar12->fpclass;
              local_488.prec_elem = pcVar12->prec_elem;
              iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (pcVar13,&local_488);
              if (iVar10 == 0) {
                local_388[*local_380] = iVar11;
                *local_380 = *local_380 + 1;
              }
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (pcVar13,&local_2e8);
            if (pcVar13->fpclass != cpp_dec_float_NaN) {
              local_488.fpclass = cpp_dec_float_finite;
              local_488.prec_elem = 10;
              local_488.data._M_elems[0] = 0;
              local_488.data._M_elems[1] = 0;
              local_488.data._M_elems[2] = 0;
              local_488.data._M_elems[3] = 0;
              local_488.data._M_elems[4] = 0;
              local_488.data._M_elems[5] = 0;
              local_488.data._M_elems._24_5_ = 0;
              local_488.data._M_elems[7]._1_3_ = 0;
              local_488.data._M_elems[8] = 0;
              local_488.data._M_elems[9] = 0;
              local_488.exp = 0;
              local_488.neg = false;
              pcVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
              local_488.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar12->data)._M_elems;
              local_488.data._M_elems._16_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 4);
              uVar4 = *(undefined8 *)((pcVar12->data)._M_elems + 6);
              local_488.data._M_elems._24_5_ = SUB85(uVar4,0);
              local_488.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
              local_488.data._M_elems._32_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 8);
              local_488.exp = pcVar12->exp;
              local_488.neg = pcVar12->neg;
              local_488.fpclass = pcVar12->fpclass;
              local_488.prec_elem = pcVar12->prec_elem;
              iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (pcVar13,&local_488);
              if (iVar11 == 0) {
                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                          ((cpp_dec_float<50u,int,void> *)pcVar13,1e-100);
              }
            }
            piVar14 = piVar14 + 1;
            pcVar15 = pcVar15 + 1;
          }
        }
        else {
          for (iVar9 = local_3f8[local_440 + 1]; (int)local_448 < iVar9; iVar9 = iVar9 + -1) {
            iVar11 = *piVar14;
            local_268.fpclass = cpp_dec_float_finite;
            local_268.prec_elem = 10;
            local_268.data._M_elems[0] = 0;
            local_268.data._M_elems[1] = 0;
            local_268.data._M_elems[2] = 0;
            local_268.data._M_elems[3] = 0;
            local_268.data._M_elems[4] = 0;
            local_268.data._M_elems[5] = 0;
            local_268.data._M_elems._24_5_ = 0;
            local_268.data._M_elems[7]._1_3_ = 0;
            local_268.data._M_elems[8] = 0;
            local_268.data._M_elems[9] = 0;
            local_268.exp = 0;
            local_268.neg = false;
            pcVar13 = &local_3e8;
            if (pcVar15 != &local_268) {
              local_268.data._M_elems[8] = local_3e8.data._M_elems[8];
              local_268.data._M_elems[9] = local_3e8.data._M_elems[9];
              local_268.data._M_elems[4] = local_3e8.data._M_elems[4];
              local_268.data._M_elems[5] = local_3e8.data._M_elems[5];
              local_268.data._M_elems._24_5_ = local_3e8.data._M_elems._24_5_;
              local_268.data._M_elems[7]._1_3_ = local_3e8.data._M_elems[7]._1_3_;
              local_268.data._M_elems[2] = local_3e8.data._M_elems[2];
              local_268.data._M_elems[3] = local_3e8.data._M_elems[3];
              local_268.data._M_elems[0] = local_3e8.data._M_elems[0];
              local_268.data._M_elems[1] = local_3e8.data._M_elems[1];
              local_268.exp = local_3e8.exp;
              local_268.neg = local_3e8.neg;
              local_268.fpclass = local_3e8.fpclass;
              local_268.prec_elem = local_3e8.prec_elem;
              pcVar13 = pcVar15;
            }
            local_3a0 = CONCAT44(local_3a0._4_4_,iVar11);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      (&local_268,pcVar13);
            pcVar13 = &local_3f0[iVar11].m_backend;
            if (local_3f0[iVar11].m_backend.fpclass != cpp_dec_float_NaN) {
              local_488.fpclass = cpp_dec_float_finite;
              local_488.prec_elem = 10;
              local_488.data._M_elems[0] = 0;
              local_488.data._M_elems[1] = 0;
              local_488.data._M_elems[2] = 0;
              local_488.data._M_elems[3] = 0;
              local_488.data._M_elems[4] = 0;
              local_488.data._M_elems[5] = 0;
              local_488.data._M_elems._24_5_ = 0;
              local_488.data._M_elems[7]._1_3_ = 0;
              local_488.data._M_elems[8] = 0;
              local_488.data._M_elems[9] = 0;
              local_488.exp = 0;
              local_488.neg = false;
              pcVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
              local_488.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar12->data)._M_elems;
              local_488.data._M_elems._16_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 4);
              uVar4 = *(undefined8 *)((pcVar12->data)._M_elems + 6);
              local_488.data._M_elems._24_5_ = SUB85(uVar4,0);
              local_488.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
              local_488.data._M_elems._32_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 8);
              local_488.exp = pcVar12->exp;
              local_488.neg = pcVar12->neg;
              local_488.fpclass = pcVar12->fpclass;
              local_488.prec_elem = pcVar12->prec_elem;
              iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (pcVar13,&local_488);
              if (iVar10 == 0) {
                local_388[*local_380] = (int)local_3a0;
                *local_380 = *local_380 + 1;
              }
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (pcVar13,&local_268);
            if (pcVar13->fpclass != cpp_dec_float_NaN) {
              local_488.fpclass = cpp_dec_float_finite;
              local_488.prec_elem = 10;
              local_488.data._M_elems[0] = 0;
              local_488.data._M_elems[1] = 0;
              local_488.data._M_elems[2] = 0;
              local_488.data._M_elems[3] = 0;
              local_488.data._M_elems[4] = 0;
              local_488.data._M_elems[5] = 0;
              local_488.data._M_elems._24_5_ = 0;
              local_488.data._M_elems[7]._1_3_ = 0;
              local_488.data._M_elems[8] = 0;
              local_488.data._M_elems[9] = 0;
              local_488.exp = 0;
              local_488.neg = false;
              pcVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
              local_488.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar12->data)._M_elems;
              local_488.data._M_elems._16_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 4);
              uVar4 = *(undefined8 *)((pcVar12->data)._M_elems + 6);
              local_488.data._M_elems._24_5_ = SUB85(uVar4,0);
              local_488.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
              local_488.data._M_elems._32_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 8);
              local_488.exp = pcVar12->exp;
              local_488.neg = pcVar12->neg;
              local_488.fpclass = pcVar12->fpclass;
              local_488.prec_elem = pcVar12->prec_elem;
              iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (pcVar13,&local_488);
              if (iVar10 == 0) {
                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                          ((cpp_dec_float<50u,int,void> *)pcVar13,1e-100);
              }
            }
            local_2a8.fpclass = cpp_dec_float_finite;
            local_2a8.prec_elem = 10;
            local_2a8.data._M_elems[0] = 0;
            local_2a8.data._M_elems[1] = 0;
            local_2a8.data._M_elems[2] = 0;
            local_2a8.data._M_elems[3] = 0;
            local_2a8.data._M_elems[4] = 0;
            local_2a8.data._M_elems[5] = 0;
            local_2a8.data._M_elems._24_5_ = 0;
            local_2a8.data._M_elems[7]._1_3_ = 0;
            local_2a8.data._M_elems[8] = 0;
            local_2a8.data._M_elems[9] = 0;
            local_2a8.exp = 0;
            local_2a8.neg = false;
            pcVar13 = &local_438;
            if (pcVar15 != &local_2a8) {
              local_2a8.data._M_elems[8] = local_438.data._M_elems[8];
              local_2a8.data._M_elems[9] = local_438.data._M_elems[9];
              local_2a8.data._M_elems[4] = local_438.data._M_elems[4];
              local_2a8.data._M_elems[5] = local_438.data._M_elems[5];
              local_2a8.data._M_elems._24_5_ = local_438.data._M_elems._24_5_;
              local_2a8.data._M_elems[7]._1_3_ = local_438.data._M_elems[7]._1_3_;
              local_2a8.data._M_elems[2] = local_438.data._M_elems[2];
              local_2a8.data._M_elems[3] = local_438.data._M_elems[3];
              local_2a8.data._M_elems[0] = local_438.data._M_elems[0];
              local_2a8.data._M_elems[1] = local_438.data._M_elems[1];
              local_2a8.exp = local_438.exp;
              local_2a8.neg = local_438.neg;
              local_2a8.fpclass = local_438.fpclass;
              local_2a8.prec_elem = local_438.prec_elem;
              pcVar13 = pcVar15;
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      (&local_2a8,pcVar13);
            pcVar13 = &vec2[iVar11].m_backend;
            if (vec2[iVar11].m_backend.fpclass != cpp_dec_float_NaN) {
              local_488.fpclass = cpp_dec_float_finite;
              local_488.prec_elem = 10;
              local_488.data._M_elems[0] = 0;
              local_488.data._M_elems[1] = 0;
              local_488.data._M_elems[2] = 0;
              local_488.data._M_elems[3] = 0;
              local_488.data._M_elems[4] = 0;
              local_488.data._M_elems[5] = 0;
              local_488.data._M_elems._24_5_ = 0;
              local_488.data._M_elems[7]._1_3_ = 0;
              local_488.data._M_elems[8] = 0;
              local_488.data._M_elems[9] = 0;
              local_488.exp = 0;
              local_488.neg = false;
              pcVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
              local_488.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar12->data)._M_elems;
              local_488.data._M_elems._16_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 4);
              uVar4 = *(undefined8 *)((pcVar12->data)._M_elems + 6);
              local_488.data._M_elems._24_5_ = SUB85(uVar4,0);
              local_488.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
              local_488.data._M_elems._32_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 8);
              local_488.exp = pcVar12->exp;
              local_488.neg = pcVar12->neg;
              local_488.fpclass = pcVar12->fpclass;
              local_488.prec_elem = pcVar12->prec_elem;
              iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (pcVar13,&local_488);
              if (iVar11 == 0) {
                ridx2[*rn2] = (int)local_3a0;
                *rn2 = *rn2 + 1;
              }
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (pcVar13,&local_2a8);
            if (pcVar13->fpclass != cpp_dec_float_NaN) {
              local_488.fpclass = cpp_dec_float_finite;
              local_488.prec_elem = 10;
              local_488.data._M_elems[0] = 0;
              local_488.data._M_elems[1] = 0;
              local_488.data._M_elems[2] = 0;
              local_488.data._M_elems[3] = 0;
              local_488.data._M_elems[4] = 0;
              local_488.data._M_elems[5] = 0;
              local_488.data._M_elems._24_5_ = 0;
              local_488.data._M_elems[7]._1_3_ = 0;
              local_488.data._M_elems[8] = 0;
              local_488.data._M_elems[9] = 0;
              local_488.exp = 0;
              local_488.neg = false;
              pcVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
              local_488.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar12->data)._M_elems;
              local_488.data._M_elems._16_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 4);
              uVar4 = *(undefined8 *)((pcVar12->data)._M_elems + 6);
              local_488.data._M_elems._24_5_ = SUB85(uVar4,0);
              local_488.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
              local_488.data._M_elems._32_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 8);
              local_488.exp = pcVar12->exp;
              local_488.neg = pcVar12->neg;
              local_488.fpclass = pcVar12->fpclass;
              local_488.prec_elem = pcVar12->prec_elem;
              iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (pcVar13,&local_488);
              if (iVar11 == 0) {
                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                          ((cpp_dec_float<50u,int,void> *)pcVar13,1e-100);
              }
            }
            piVar14 = piVar14 + 1;
            pcVar15 = pcVar15 + 1;
          }
        }
      }
      uVar18 = local_440 + 1;
      this = local_330;
    } while (uVar18 != local_3a8);
  }
  if ((this->l).updateType != 0) {
    uVar3 = (this->l).firstUnused;
    local_3a0 = (ulong)uVar3;
    if ((int)local_3a8 < (int)uVar3) {
      local_448 = local_3a8 & 0xffffffff;
      do {
        iVar9 = local_3f8[local_448];
        local_368.fpclass = cpp_dec_float_finite;
        local_368.prec_elem = 10;
        local_368.data._M_elems[0] = 0;
        local_368.data._M_elems[1] = 0;
        local_368.data._M_elems[2] = 0;
        local_368.data._M_elems[3] = 0;
        local_368.data._M_elems[4] = 0;
        local_368.data._M_elems[5] = 0;
        local_368.data._M_elems._24_5_ = 0;
        local_368.data._M_elems[7]._1_3_ = 0;
        local_368.data._M_elems[8] = 0;
        local_368.data._M_elems[9] = 0;
        local_368.exp = 0;
        local_368.neg = false;
        local_228.fpclass = cpp_dec_float_finite;
        local_228.prec_elem = 10;
        local_228.data._M_elems[0] = 0;
        local_228.data._M_elems[1] = 0;
        local_228.data._M_elems[2] = 0;
        local_228.data._M_elems[3] = 0;
        local_228.data._M_elems[4] = 0;
        local_228.data._M_elems[5] = 0;
        local_228.data._M_elems._24_5_ = 0;
        local_228.data._M_elems[7]._1_3_ = 0;
        local_228.data._M_elems[8] = 0;
        local_228.data._M_elems[9] = 0;
        local_228.exp = 0;
        local_228.neg = false;
        iVar11 = local_3f8[local_448 + 1];
        if (iVar9 < iVar11) {
          pcVar15 = &local_390[iVar9].m_backend;
          piVar14 = local_398 + iVar9;
          do {
            pcVar12 = &local_3f0[*piVar14].m_backend;
            local_488.fpclass = cpp_dec_float_finite;
            local_488.prec_elem = 10;
            local_488.data._M_elems[0] = 0;
            local_488.data._M_elems[1] = 0;
            local_488.data._M_elems[2] = 0;
            local_488.data._M_elems[3] = 0;
            local_488.data._M_elems[4] = 0;
            local_488.data._M_elems[5] = 0;
            local_488.data._M_elems._24_5_ = 0;
            local_488.data._M_elems[7]._1_3_ = 0;
            local_488.data._M_elems[8] = 0;
            local_488.data._M_elems[9] = 0;
            local_488.exp = 0;
            local_488.neg = false;
            pcVar13 = pcVar12;
            if ((pcVar15 != &local_488) && (pcVar13 = pcVar15, &local_488 != pcVar12)) {
              local_488.data._M_elems._32_8_ =
                   *(undefined8 *)
                    ((((cpp_dec_float<50U,_int,_void> *)&pcVar12->data)->data)._M_elems + 8);
              local_488.data._M_elems._0_16_ =
                   *(undefined1 (*) [16])
                    (((cpp_dec_float<50U,_int,_void> *)&pcVar12->data)->data)._M_elems;
              local_488.data._M_elems._16_8_ =
                   *(undefined8 *)
                    ((((cpp_dec_float<50U,_int,_void> *)&pcVar12->data)->data)._M_elems + 4);
              uVar4 = *(undefined8 *)
                       ((((cpp_dec_float<50U,_int,_void> *)&pcVar12->data)->data)._M_elems + 6);
              local_488.data._M_elems._24_5_ = SUB85(uVar4,0);
              local_488.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
              local_488.exp = pcVar12->exp;
              local_488.neg = pcVar12->neg;
              local_488.fpclass = pcVar12->fpclass;
              local_488.prec_elem = pcVar12->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      (&local_488,pcVar13);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_368,&local_488);
            pcVar12 = &vec2[*piVar14].m_backend;
            local_488.fpclass = cpp_dec_float_finite;
            local_488.prec_elem = 10;
            local_488.data._M_elems[0] = 0;
            local_488.data._M_elems[1] = 0;
            local_488.data._M_elems[2] = 0;
            local_488.data._M_elems[3] = 0;
            local_488.data._M_elems[4] = 0;
            local_488.data._M_elems[5] = 0;
            local_488.data._M_elems._24_5_ = 0;
            local_488.data._M_elems[7]._1_3_ = 0;
            local_488.data._M_elems[8] = 0;
            local_488.data._M_elems[9] = 0;
            local_488.exp = 0;
            local_488.neg = false;
            pcVar13 = pcVar12;
            if ((pcVar15 != &local_488) && (pcVar13 = pcVar15, &local_488 != pcVar12)) {
              local_488.data._M_elems._32_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 8);
              local_488.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar12->data)._M_elems;
              local_488.data._M_elems._16_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 4);
              uVar4 = *(undefined8 *)((pcVar12->data)._M_elems + 6);
              local_488.data._M_elems._24_5_ = SUB85(uVar4,0);
              local_488.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
              local_488.exp = pcVar12->exp;
              local_488.neg = pcVar12->neg;
              local_488.fpclass = pcVar12->fpclass;
              local_488.prec_elem = pcVar12->prec_elem;
            }
            piVar14 = piVar14 + 1;
            pcVar15 = pcVar15 + 1;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      (&local_488,pcVar13);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_228,&local_488);
            iVar11 = iVar11 + -1;
          } while (iVar9 < iVar11);
          local_3e8.fpclass = local_368.fpclass;
          local_3e8.prec_elem = local_368.prec_elem;
        }
        else {
          local_3e8.prec_elem = 10;
          local_3e8.fpclass = cpp_dec_float_finite;
        }
        auVar8 = (undefined1  [16])local_228.data._M_elems._0_16_;
        auVar7 = (undefined1  [16])local_368.data._M_elems._0_16_;
        uVar18 = local_448;
        local_3e8.data._M_elems[8] = local_368.data._M_elems[8];
        local_3e8.data._M_elems[9] = local_368.data._M_elems[9];
        local_3e8.data._M_elems[4] = local_368.data._M_elems[4];
        local_3e8.data._M_elems[5] = local_368.data._M_elems[5];
        local_3e8.data._M_elems._24_5_ = local_368.data._M_elems._24_5_;
        local_3e8.data._M_elems[7]._1_3_ = local_368.data._M_elems[7]._1_3_;
        local_3e8.data._M_elems[0] = local_368.data._M_elems[0];
        local_3e8.data._M_elems[1] = local_368.data._M_elems[1];
        uVar4 = local_3e8.data._M_elems._0_8_;
        local_3e8.data._M_elems[0] = local_368.data._M_elems[0];
        local_3e8.data._M_elems[1] = local_368.data._M_elems[1];
        local_3e8.data._M_elems[2] = local_368.data._M_elems[2];
        local_3e8.data._M_elems[3] = local_368.data._M_elems[3];
        local_438.data._M_elems[0] = local_228.data._M_elems[0];
        local_438.data._M_elems[1] = local_228.data._M_elems[1];
        local_438.data._M_elems[2] = local_228.data._M_elems[2];
        local_438.data._M_elems[3] = local_228.data._M_elems[3];
        local_438.data._M_elems[4] = local_228.data._M_elems[4];
        local_438.data._M_elems[5] = local_228.data._M_elems[5];
        local_438.data._M_elems._24_5_ = local_228.data._M_elems._24_5_;
        local_438.data._M_elems[7]._1_3_ = local_228.data._M_elems[7]._1_3_;
        local_438.data._M_elems[8] = local_228.data._M_elems[8];
        local_438.data._M_elems[9] = local_228.data._M_elems[9];
        iVar9 = local_378[local_448];
        local_488.data._M_elems[8] = local_368.data._M_elems[8];
        local_488.data._M_elems[9] = local_368.data._M_elems[9];
        local_488.data._M_elems[4] = local_368.data._M_elems[4];
        local_488.data._M_elems[5] = local_368.data._M_elems[5];
        local_488.data._M_elems._24_5_ = local_368.data._M_elems._24_5_;
        local_488.data._M_elems[7]._1_3_ = local_368.data._M_elems[7]._1_3_;
        local_368.data._M_elems[0] = auVar7._0_4_;
        local_368.data._M_elems[1] = auVar7._4_4_;
        local_368.data._M_elems[2] = auVar7._8_4_;
        local_368.data._M_elems[3] = auVar7._12_4_;
        local_488.data._M_elems[0] = local_368.data._M_elems[0];
        local_488.data._M_elems[1] = local_368.data._M_elems[1];
        local_488.data._M_elems[2] = local_368.data._M_elems[2];
        local_488.data._M_elems[3] = local_368.data._M_elems[3];
        auVar5 = (undefined1  [16])local_488.data._M_elems._0_16_;
        local_a8.data._M_elems._0_8_ = *(undefined8 *)(local_370->m_backend).data._M_elems;
        local_a8.data._M_elems._8_8_ = *(undefined8 *)((local_370->m_backend).data._M_elems + 2);
        local_a8.data._M_elems._16_8_ = *(undefined8 *)((local_370->m_backend).data._M_elems + 4);
        local_a8.data._M_elems._24_8_ = *(undefined8 *)((local_370->m_backend).data._M_elems + 6);
        local_a8.data._M_elems._32_8_ = *(undefined8 *)((local_370->m_backend).data._M_elems + 8);
        local_a8.exp = (local_370->m_backend).exp;
        local_a8.neg = (local_370->m_backend).neg;
        local_a8.fpclass = (local_370->m_backend).fpclass;
        local_a8.prec_elem = (local_370->m_backend).prec_elem;
        local_488.prec_elem = local_3e8.prec_elem;
        local_488.fpclass = local_3e8.fpclass;
        local_488.neg = local_368.neg;
        if (((local_368.neg & 1U) != 0) &&
           (local_488.data._M_elems[0] = auVar7._0_4_,
           local_488.data._M_elems[0] != 0 || local_3e8.fpclass != cpp_dec_float_finite)) {
          local_488.neg = (bool)(local_368.neg ^ 1);
        }
        local_440 = CONCAT44(local_440._4_4_,iVar9);
        local_438.exp = local_228.exp;
        local_438.neg = local_228.neg;
        local_438._48_8_ = local_228._48_8_;
        local_3e8.exp = local_368.exp;
        local_3e8.neg = local_368.neg;
        local_368.data._M_elems._0_16_ = auVar7;
        local_228.data._M_elems._0_16_ = auVar8;
        if ((local_a8.fpclass != cpp_dec_float_NaN && local_3e8.fpclass != cpp_dec_float_NaN) &&
           (local_488.data._M_elems._0_16_ = auVar5, local_488.exp = local_368.exp,
           iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_488,&local_a8), uVar4 = local_3e8.data._M_elems._0_8_,
           0 < iVar11)) {
          local_e8.data._M_elems[8] = local_3e8.data._M_elems[8];
          local_e8.data._M_elems[9] = local_3e8.data._M_elems[9];
          local_e8.data._M_elems[7]._1_3_ = local_3e8.data._M_elems[7]._1_3_;
          local_e8.data._M_elems._24_5_ = local_3e8.data._M_elems._24_5_;
          local_e8.data._M_elems[4] = local_3e8.data._M_elems[4];
          local_e8.data._M_elems[5] = local_3e8.data._M_elems[5];
          local_e8.data._M_elems[0] = local_3e8.data._M_elems[0];
          local_e8.data._M_elems[1] = local_3e8.data._M_elems[1];
          local_e8.data._M_elems[2] = local_3e8.data._M_elems[2];
          local_e8.data._M_elems[3] = local_3e8.data._M_elems[3];
          local_e8.exp = local_3e8.exp;
          local_e8.neg = local_3e8.neg;
          local_e8.fpclass = local_3e8.fpclass;
          local_e8.prec_elem = local_3e8.prec_elem;
          pcVar15 = &local_3f0[iVar9].m_backend;
          if (local_3f0[iVar9].m_backend.fpclass != cpp_dec_float_NaN) {
            local_488.fpclass = cpp_dec_float_finite;
            local_488.prec_elem = 10;
            local_488.data._M_elems[0] = 0;
            local_488.data._M_elems[1] = 0;
            local_488.data._M_elems[2] = 0;
            local_488.data._M_elems[3] = 0;
            local_488.data._M_elems[4] = 0;
            local_488.data._M_elems[5] = 0;
            local_488.data._M_elems._24_5_ = 0;
            local_488.data._M_elems[7]._1_3_ = 0;
            local_488.data._M_elems[8] = 0;
            local_488.data._M_elems[9] = 0;
            local_488.exp = 0;
            local_488.neg = false;
            pcVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
            local_488.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar13->data)._M_elems;
            local_488.data._M_elems._16_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 4);
            uVar4 = *(undefined8 *)((pcVar13->data)._M_elems + 6);
            local_488.data._M_elems._24_5_ = SUB85(uVar4,0);
            local_488.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
            local_488.data._M_elems._32_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 8);
            local_488.exp = pcVar13->exp;
            local_488.neg = pcVar13->neg;
            local_488.fpclass = pcVar13->fpclass;
            local_488.prec_elem = pcVar13->prec_elem;
            iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (pcVar15,&local_488);
            if (iVar11 == 0) {
              local_388[*local_380] = (int)local_440;
              *local_380 = *local_380 + 1;
            }
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (pcVar15,&local_e8);
          uVar4 = local_3e8.data._M_elems._0_8_;
          if (pcVar15->fpclass != cpp_dec_float_NaN) {
            local_488.fpclass = cpp_dec_float_finite;
            local_488.prec_elem = 10;
            local_488.data._M_elems[0] = 0;
            local_488.data._M_elems[1] = 0;
            local_488.data._M_elems[2] = 0;
            local_488.data._M_elems[3] = 0;
            local_488.data._M_elems[4] = 0;
            local_488.data._M_elems[5] = 0;
            local_488.data._M_elems._24_5_ = 0;
            local_488.data._M_elems[7]._1_3_ = 0;
            local_488.data._M_elems[8] = 0;
            local_488.data._M_elems[9] = 0;
            local_488.exp = 0;
            local_488.neg = false;
            pcVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
            local_488.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar13->data)._M_elems;
            local_488.data._M_elems._16_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 4);
            uVar4 = *(undefined8 *)((pcVar13->data)._M_elems + 6);
            local_488.data._M_elems._24_5_ = SUB85(uVar4,0);
            local_488.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
            local_488.data._M_elems._32_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 8);
            local_488.exp = pcVar13->exp;
            local_488.neg = pcVar13->neg;
            local_488.fpclass = pcVar13->fpclass;
            local_488.prec_elem = pcVar13->prec_elem;
            iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (pcVar15,&local_488);
            uVar4 = local_3e8.data._M_elems._0_8_;
            if (iVar11 == 0) {
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)pcVar15,1e-100);
              uVar4 = local_3e8.data._M_elems._0_8_;
            }
          }
        }
        local_3e8.data._M_elems._0_8_ = uVar4;
        local_488.data._M_elems[8] = local_438.data._M_elems[8];
        local_488.data._M_elems[9] = local_438.data._M_elems[9];
        local_488.data._M_elems[4] = local_438.data._M_elems[4];
        local_488.data._M_elems[5] = local_438.data._M_elems[5];
        local_488.data._M_elems._24_5_ = local_438.data._M_elems._24_5_;
        local_488.data._M_elems[7]._1_3_ = local_438.data._M_elems[7]._1_3_;
        local_488.data._M_elems[2] = local_438.data._M_elems[2];
        local_488.data._M_elems[3] = local_438.data._M_elems[3];
        local_488.data._M_elems[0] = local_438.data._M_elems[0];
        local_488.data._M_elems[1] = local_438.data._M_elems[1];
        auVar5 = (undefined1  [16])local_488.data._M_elems._0_16_;
        local_128.data._M_elems._0_8_ = *(undefined8 *)(eps2->m_backend).data._M_elems;
        local_128.data._M_elems._8_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 2);
        local_128.data._M_elems._16_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 4);
        local_128.data._M_elems._24_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 6);
        local_128.data._M_elems._32_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 8);
        local_128.exp = (eps2->m_backend).exp;
        local_128.neg = (eps2->m_backend).neg;
        local_128.fpclass = (eps2->m_backend).fpclass;
        local_128.prec_elem = (eps2->m_backend).prec_elem;
        local_488.exp = local_438.exp;
        local_488.neg = local_438.neg;
        local_488.fpclass = local_438.fpclass;
        local_488.prec_elem = local_438.prec_elem;
        if ((local_438.neg == true) &&
           (local_488.data._M_elems[0] = local_438.data._M_elems[0],
           local_488.data._M_elems[0] != 0 || local_438.fpclass != cpp_dec_float_finite)) {
          local_488.neg = false;
        }
        if ((local_128.fpclass != cpp_dec_float_NaN && local_438.fpclass != cpp_dec_float_NaN) &&
           (local_488.data._M_elems._0_16_ = auVar5,
           iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_488,&local_128), 0 < iVar11)) {
          local_168.data._M_elems[8] = local_438.data._M_elems[8];
          local_168.data._M_elems[9] = local_438.data._M_elems[9];
          local_168.data._M_elems[7]._1_3_ = local_438.data._M_elems[7]._1_3_;
          local_168.data._M_elems._24_5_ = local_438.data._M_elems._24_5_;
          local_168.data._M_elems[4] = local_438.data._M_elems[4];
          local_168.data._M_elems[5] = local_438.data._M_elems[5];
          local_168.data._M_elems[0] = local_438.data._M_elems[0];
          local_168.data._M_elems[1] = local_438.data._M_elems[1];
          local_168.data._M_elems[2] = local_438.data._M_elems[2];
          local_168.data._M_elems[3] = local_438.data._M_elems[3];
          local_168.exp = local_438.exp;
          local_168.neg = local_438.neg;
          local_168.fpclass = local_438.fpclass;
          local_168.prec_elem = local_438.prec_elem;
          pcVar15 = &vec2[iVar9].m_backend;
          if (vec2[iVar9].m_backend.fpclass != cpp_dec_float_NaN) {
            local_488.fpclass = cpp_dec_float_finite;
            local_488.prec_elem = 10;
            local_488.data._M_elems[0] = 0;
            local_488.data._M_elems[1] = 0;
            local_488.data._M_elems[2] = 0;
            local_488.data._M_elems[3] = 0;
            local_488.data._M_elems[4] = 0;
            local_488.data._M_elems[5] = 0;
            local_488.data._M_elems._24_5_ = 0;
            local_488.data._M_elems[7]._1_3_ = 0;
            local_488.data._M_elems[8] = 0;
            local_488.data._M_elems[9] = 0;
            local_488.exp = 0;
            local_488.neg = false;
            pcVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
            local_488.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar13->data)._M_elems;
            local_488.data._M_elems._16_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 4);
            uVar4 = *(undefined8 *)((pcVar13->data)._M_elems + 6);
            local_488.data._M_elems._24_5_ = SUB85(uVar4,0);
            local_488.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
            local_488.data._M_elems._32_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 8);
            local_488.exp = pcVar13->exp;
            local_488.neg = pcVar13->neg;
            local_488.fpclass = pcVar13->fpclass;
            local_488.prec_elem = pcVar13->prec_elem;
            iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (pcVar15,&local_488);
            if (iVar9 == 0) {
              ridx2[*rn2] = (int)local_440;
              *rn2 = *rn2 + 1;
            }
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (pcVar15,&local_168);
          if (pcVar15->fpclass != cpp_dec_float_NaN) {
            local_488.fpclass = cpp_dec_float_finite;
            local_488.prec_elem = 10;
            local_488.data._M_elems[0] = 0;
            local_488.data._M_elems[1] = 0;
            local_488.data._M_elems[2] = 0;
            local_488.data._M_elems[3] = 0;
            local_488.data._M_elems[4] = 0;
            local_488.data._M_elems[5] = 0;
            local_488.data._M_elems._24_5_ = 0;
            local_488.data._M_elems[7]._1_3_ = 0;
            local_488.data._M_elems[8] = 0;
            local_488.data._M_elems[9] = 0;
            local_488.exp = 0;
            local_488.neg = false;
            pcVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
            local_488.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar13->data)._M_elems;
            local_488.data._M_elems._16_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 4);
            uVar4 = *(undefined8 *)((pcVar13->data)._M_elems + 6);
            local_488.data._M_elems._24_5_ = SUB85(uVar4,0);
            local_488.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
            local_488.data._M_elems._32_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 8);
            local_488.exp = pcVar13->exp;
            local_488.neg = pcVar13->neg;
            local_488.fpclass = pcVar13->fpclass;
            local_488.prec_elem = pcVar13->prec_elem;
            iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (pcVar15,&local_488);
            if (iVar9 == 0) {
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)pcVar15,1e-100);
            }
          }
        }
        local_448 = uVar18 + 1;
      } while (local_448 != local_3a0);
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveLright2(
   R* vec, int* ridx, int& rn, R eps,
   R* vec2, int* ridx2, int& rn2, R eps2)
{
   int i, j, k, n;
   int end;
   R x, x2;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   end = l.firstUpdate;

   // loop through columns of L
   for(i = 0; i < end; ++i)
   {
      j = lrow[i];
      x2 = vec2[j];
      x = vec[j];

      // check whether there is a corresponding value in the first rhs VectorBase<R>; skipping/ignoring FACTOR_MARKER
      if(isNotZero(x, eps))
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         // check whether there is  also a corresponding value in the second rhs VectorBase<R>; skipping/ignoring FACTOR_MARKER
         if(isNotZero(x2, eps2))
         {
            for(j = lbeg[i + 1]; j > k; --j)
            {
               assert(*idx >= 0 && *idx < thedim);
               n = *idx++;
               updateSolutionVectorLright(x * (*val), n, vec[n], ridx, rn);
               updateSolutionVectorLright(x2 * (*val), n, vec2[n], ridx2, rn2);
               ++val;
            }
         }
         // only the first VectorBase<R> needs to be modified
         else
         {
            for(j = lbeg[i + 1]; j > k; --j)
            {
               assert(*idx >= 0 && *idx < thedim);
               n = *idx++;
               updateSolutionVectorLright(x * (*val), n, vec[n], ridx, rn);
               ++val;
            }
         }
      }
      // only the second VectorBase<R> needs to be modified
      else if(isNotZero(x2, eps2))
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         for(j = lbeg[i + 1]; j > k; --j)
         {
            assert(*idx >= 0 && *idx < thedim);
            n = *idx++;
            updateSolutionVectorLright(x2 * (*val), n, vec2[n], ridx2, rn2);
            ++val;
         }
      }
   }

   if(l.updateType)                     /* Forest-Tomlin Updates */
   {
      end = l.firstUnused;

      for(; i < end; ++i)
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         StableSum<R> tmp1, tmp2;

         for(j = lbeg[i + 1]; j > k; --j)
         {
            assert(*idx >= 0 && *idx < thedim);
            tmp1 += vec[*idx] * (*val);
            tmp2 += vec2[*idx++] * (*val++);
         }

         x = R(tmp1);
         x2 = R(tmp2);

         j = lrow[i];

         if(isNotZero(x, eps))
            updateSolutionVectorLright(x, j, vec[j], ridx, rn);

         if(isNotZero(x2, eps2))
            updateSolutionVectorLright(x2, j, vec2[j], ridx2, rn2);
      }
   }
}